

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void rest_regions(memfile *mf,level *lev,boolean ghostly)

{
  short sVar1;
  bool bVar2;
  int8_t iVar3;
  boolean bVar4;
  ushort uVar5;
  int16_t iVar6;
  int16_t iVar7;
  int32_t iVar8;
  uint uVar9;
  region **pprVar10;
  region *prVar11;
  nhrect *pnVar12;
  uint *puVar13;
  char *pcVar14;
  short sVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint *nidp;
  long lVar21;
  
  free_regions(lev);
  mfmagic_check(mf,0x49474552);
  iVar8 = mread32(mf);
  lVar16 = (ulong)moves - (long)iVar8;
  if (ghostly != '\0') {
    lVar16 = 0;
  }
  uVar9 = mread32(mf);
  lev->n_regions = uVar9;
  lev->max_regions = uVar9;
  if (0 < (int)uVar9) {
    pprVar10 = (region **)malloc((ulong)uVar9 << 3);
    lev->regions = pprVar10;
    lVar18 = 0;
    do {
      prVar11 = (region *)malloc(0x58);
      lev->regions[lVar18] = prVar11;
      prVar11 = lev->regions[lVar18];
      prVar11->n_monst = 0;
      prVar11->max_monst = 0;
      prVar11->visible = '\0';
      *(undefined3 *)&prVar11->field_0x4d = 0;
      prVar11->effect_id = 0;
      prVar11->arg = 0;
      prVar11->can_leave_f = 0;
      prVar11->leave_f = 0;
      prVar11->inside_f = 0;
      prVar11->player_flags = '\0';
      prVar11->field_0x3f = 0;
      prVar11->monsters = (uint *)0x0;
      prVar11->leave_msg = (char *)0x0;
      prVar11->ttl = 0;
      prVar11->expire_f = 0;
      prVar11->can_enter_f = 0;
      prVar11->enter_f = 0;
      *(undefined8 *)&prVar11->attach_2_m = 0;
      prVar11->enter_msg = (char *)0x0;
      prVar11->rects = (nhrect *)0x0;
      (prVar11->bounding_box).lx = '\0';
      (prVar11->bounding_box).ly = '\0';
      (prVar11->bounding_box).hx = '\0';
      (prVar11->bounding_box).hy = '\0';
      prVar11->nrects = 0;
      prVar11->attach_2_u = '\0';
      prVar11->field_0x17 = 0;
      prVar11->lev = lev;
      mread(mf,&prVar11->bounding_box,4);
      uVar9 = mread32(mf);
      prVar11->attach_2_m = uVar9;
      iVar8 = mread32(mf);
      prVar11->effect_id = iVar8;
      iVar8 = mread32(mf);
      prVar11->arg = iVar8;
      uVar5 = mread16(mf);
      prVar11->nrects = uVar5;
      if (0 < (short)uVar5) {
        pnVar12 = (nhrect *)malloc((ulong)uVar5 << 2);
        prVar11->rects = pnVar12;
        lVar20 = 0;
        lVar21 = 0;
        do {
          mread(mf,&prVar11->rects->lx + lVar20,4);
          lVar21 = lVar21 + 1;
          lVar20 = lVar20 + 4;
        } while (lVar21 < prVar11->nrects);
      }
      iVar6 = mread16(mf);
      prVar11->ttl = iVar6;
      iVar6 = mread16(mf);
      prVar11->expire_f = iVar6;
      iVar6 = mread16(mf);
      prVar11->can_enter_f = iVar6;
      iVar6 = mread16(mf);
      prVar11->enter_f = iVar6;
      iVar6 = mread16(mf);
      prVar11->can_leave_f = iVar6;
      iVar6 = mread16(mf);
      prVar11->leave_f = iVar6;
      iVar6 = mread16(mf);
      prVar11->inside_f = iVar6;
      iVar6 = mread16(mf);
      prVar11->n_monst = iVar6;
      prVar11->max_monst = iVar6;
      iVar3 = mread8(mf);
      prVar11->player_flags = iVar3;
      iVar3 = mread8(mf);
      prVar11->attach_2_u = iVar3;
      iVar3 = mread8(mf);
      prVar11->visible = iVar3;
      if (0 < (long)prVar11->n_monst) {
        puVar13 = (uint *)malloc((long)prVar11->n_monst << 2);
        prVar11->monsters = puVar13;
        lVar20 = 0;
        do {
          uVar9 = mread32(mf);
          prVar11->monsters[lVar20] = uVar9;
          lVar20 = lVar20 + 1;
        } while (lVar20 < prVar11->n_monst);
      }
      iVar6 = mread16(mf);
      iVar7 = mread16(mf);
      if (iVar6 != 0) {
        uVar9 = (uint)iVar6;
        pcVar14 = (char *)malloc((ulong)uVar9);
        mread(mf,pcVar14,uVar9);
        pcVar14[uVar9 - 1] = '\0';
        prVar11->enter_msg = pcVar14;
      }
      if (iVar7 != 0) {
        uVar9 = (uint)iVar7;
        pcVar14 = (char *)malloc((ulong)uVar9);
        mread(mf,pcVar14,uVar9);
        pcVar14[uVar9 - 1] = '\0';
        prVar11->leave_msg = pcVar14;
      }
      sVar1 = prVar11->ttl;
      if (-1 < (long)sVar1) {
        sVar15 = sVar1 - (short)lVar16;
        if (sVar1 <= lVar16) {
          sVar15 = 0;
        }
        prVar11->ttl = sVar15;
      }
      if (ghostly != '\0') {
        prVar11->player_flags = prVar11->player_flags & 0xfcU | 2;
      }
      lVar18 = lVar18 + 1;
      iVar17 = lev->n_regions;
    } while (lVar18 < iVar17);
    lVar16 = (long)iVar17;
    if (0 < iVar17) {
      do {
        prVar11 = lev->regions[lVar16 + -1];
        if (prVar11->ttl == 0) {
          remove_region(prVar11);
        }
        else if (ghostly != '\0') {
          iVar17 = (int)prVar11->n_monst;
          if (0 < prVar11->n_monst) {
            puVar13 = prVar11->monsters;
            iVar19 = 0;
            do {
              nidp = puVar13 + iVar19;
              bVar4 = lookup_id_mapping(*nidp,nidp);
              if (bVar4 == '\0') {
                lVar18 = (long)iVar17;
                iVar17 = iVar17 + -1;
                *nidp = puVar13[lVar18 + -1];
              }
              else {
                iVar19 = iVar19 + 1;
              }
            } while (iVar19 < iVar17);
            prVar11->n_monst = (short)iVar17;
          }
        }
        bVar2 = 1 < lVar16;
        lVar16 = lVar16 + -1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void rest_regions(struct memfile *mf, struct level *lev,
		  boolean ghostly) /* If a bones file restore */
{
    int i, j;
    unsigned len1, len2;
    long tmstamp;
    char *msg_buf;
    struct region *r;

    free_regions(lev);		/* Just for security */
    mfmagic_check(mf, REGION_MAGIC);
    tmstamp = mread32(mf);
    if (ghostly)
	tmstamp = 0;
    else
	tmstamp = (moves - tmstamp);
    lev->n_regions = mread32(mf);
    lev->max_regions = lev->n_regions;
    if (lev->n_regions > 0)
	lev->regions = malloc(sizeof (struct region *) * lev->n_regions);
    
    for (i = 0; i < lev->n_regions; i++) {
	lev->regions[i] = malloc(sizeof (struct region));
	
	r = lev->regions[i];
	memset(r, 0, sizeof(struct region));
	
	r->lev = lev;
	
	mread(mf, &r->bounding_box, sizeof (struct nhrect));
	r->attach_2_m = mread32(mf);
	r->effect_id = mread32(mf);
	r->arg = mread32(mf);
	r->nrects = mread16(mf);
	if (r->nrects > 0)
	    r->rects = malloc(sizeof (struct nhrect) * r->nrects);
	for (j = 0; j < r->nrects; j++)
	    mread(mf, &r->rects[j], sizeof (struct nhrect));
	r->ttl = mread16(mf);
	r->expire_f = mread16(mf);
	r->can_enter_f = mread16(mf);
	r->enter_f = mread16(mf);
	r->can_leave_f = mread16(mf);
	r->leave_f = mread16(mf);
	r->inside_f = mread16(mf);
	r->n_monst = mread16(mf);
	r->max_monst = r->n_monst;
	r->player_flags = mread8(mf);
	r->attach_2_u = mread8(mf);
	r->visible = mread8(mf);
	
	if (r->n_monst > 0)
	    r->monsters = malloc(sizeof (unsigned) * r->n_monst);
	for (j = 0; j < r->n_monst; j++)
	    r->monsters[j] = mread32(mf);
	
	len1 = mread16(mf);
	len2 = mread16(mf);
	
	if (len1 > 0) {
	    msg_buf = malloc(len1);
	    mread(mf, msg_buf, len1);
	    msg_buf[len1 - 1] = '\0';
	    r->enter_msg = msg_buf;
	}
	
	if (len2 > 0) {
	    msg_buf = malloc(len2);
	    mread(mf, msg_buf, len2);
	    msg_buf[len2 - 1] = '\0';
	    r->leave_msg = msg_buf;
	}

	/* check for expired region */
	if (r->ttl >= 0)
	    r->ttl = (r->ttl > tmstamp) ? r->ttl - tmstamp : 0;
	
	if (ghostly) {	/* settings pertained to old player */
	    clear_hero_inside(r);
	    clear_heros_fault(r);
	}
    }
    /* remove expired lev->regions, do not trigger the expire_f callback (yet!);
       also update monster lists if this data is coming from a bones file */
    for (i = lev->n_regions - 1; i >= 0; i--)
	if (lev->regions[i]->ttl == 0)
	    remove_region(lev->regions[i]);
	else if (ghostly && lev->regions[i]->n_monst > 0)
	    reset_region_mids(lev->regions[i]);
}